

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

int Nwk_ObjDeref_rec(Nwk_Obj_t *pNode)

{
  Nwk_Obj_t *pNode_00;
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if ((*(uint *)&pNode->field_0x20 & 7) != 1) {
    iVar2 = 1;
    for (lVar3 = 0;
        (lVar3 < pNode->nFanins && (pNode_00 = pNode->pFanio[lVar3], pNode_00 != (Nwk_Obj_t *)0x0));
        lVar3 = lVar3 + 1) {
      if (pNode_00->nFanouts < 1) {
        __assert_fail("pFanin->nFanouts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkDfs.c"
                      ,0x23c,"int Nwk_ObjDeref_rec(Nwk_Obj_t *)");
      }
      iVar1 = pNode_00->nFanouts + -1;
      pNode_00->nFanouts = iVar1;
      if (iVar1 == 0) {
        iVar1 = Nwk_ObjDeref_rec(pNode_00);
        iVar2 = iVar2 + iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int Nwk_ObjDeref_rec( Nwk_Obj_t * pNode )
{
    Nwk_Obj_t * pFanin;
    int i, Counter = 1;
    if ( Nwk_ObjIsCi(pNode) )
        return 0;
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        assert( pFanin->nFanouts > 0 );
        if ( --pFanin->nFanouts == 0 )
            Counter += Nwk_ObjDeref_rec( pFanin );
    }
    return Counter;
}